

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

char * vrna_cpu_vendor_string(void)

{
  int iVar1;
  uint32_t local_18;
  char local_14 [4];
  uint32_t regs [4];
  
  memset(&local_18,0,0x10);
  iVar1 = execute_cpuid(&local_18);
  if (iVar1 != 0) {
    vrna_cpu_vendor_string::name[0] = local_14[0];
    vrna_cpu_vendor_string::name[1] = local_14[1];
    vrna_cpu_vendor_string::name[2] = local_14[2];
    vrna_cpu_vendor_string::name[3] = local_14[3];
    vrna_cpu_vendor_string::name[4] = (undefined1)regs[1];
    vrna_cpu_vendor_string::name[5] = regs[1]._1_1_;
    vrna_cpu_vendor_string::name[6] = regs[1]._2_1_;
    vrna_cpu_vendor_string::name[7] = regs[1]._3_1_;
    vrna_cpu_vendor_string::name[8] = (undefined1)regs[0];
    vrna_cpu_vendor_string::name[9] = regs[0]._1_1_;
    vrna_cpu_vendor_string::name[10] = regs[0]._2_1_;
    vrna_cpu_vendor_string::name[0xb] = regs[0]._3_1_;
    vrna_cpu_vendor_string::name[0xc] = '\0';
  }
  return vrna_cpu_vendor_string::name;
}

Assistant:

PUBLIC char *
vrna_cpu_vendor_string(void)
{
  static char name[13] = {
    0
  };
  uint32_t    regs[4] = {
    0
  };

  if (execute_cpuid(&regs[0])) {
    memcpy(name + 0, &regs[1], 4);
    memcpy(name + 4, &regs[3], 4);
    memcpy(name + 8, &regs[2], 4);
    name[12] = '\0';
  }

  return name;
}